

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O1

void __thiscall
vkt::wsi::anon_unknown_0::TriangleRenderer::TriangleRenderer
          (TriangleRenderer *this,DeviceInterface *vkd,VkDevice device,Allocator *allocator,
          BinaryCollection *binaryRegistry,
          vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
          *swapchainImages,VkFormat framebufferFormat,UVec2 *renderSize)

{
  int *piVar1;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  *this_00;
  deUint64 dVar2;
  deUint64 dVar3;
  pointer pSVar4;
  long *plVar5;
  pointer pSVar6;
  Allocation *pAVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *pvVar13;
  VkDevice pVVar14;
  VkAllocationCallbacks *pVVar15;
  Handle<(vk::HandleType)18> HVar16;
  DeviceInterface *pDVar17;
  int i;
  VkResult VVar18;
  long lVar19;
  const_iterator cVar20;
  deUint64 *pdVar21;
  long *plVar22;
  ulong uVar23;
  pointer pHVar24;
  VkPipelineDepthStencilStateCreateInfo depthStencilParams;
  VkMappedMemoryRange memRange;
  VkSubpassDependency dependencies [2];
  Unique<vk::Handle<(vk::HandleType)14>_> fragShaderModule;
  Unique<vk::Handle<(vk::HandleType)14>_> vertShaderModule;
  VkAttachmentReference colorAttRef;
  VkAttachmentDescription colorAttDesc;
  VkVertexInputBindingDescription vertexBinding0;
  VkVertexInputAttributeDescription vertexAttrib0;
  VkRect2D scissor0;
  VkViewport viewport0;
  VkPipelineColorBlendAttachmentState attBlendParams0;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyParams;
  VkSpecializationInfo emptyShaderSpecParams;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  undefined1 local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined8 local_3c8;
  VkSubpassDescription *pVStack_3c0;
  undefined8 local_3b8;
  VkPipelineShaderStageCreateInfo *pVStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  Unique<vk::Handle<(vk::HandleType)17>_> *local_378;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *local_370;
  undefined1 local_368 [16];
  VkDevice local_358;
  VkImage VStack_350;
  undefined8 local_348;
  VkPipelineShaderStageCreateInfo *pVStack_340;
  VkPipelineTessellationStateCreateInfo *local_338;
  VkPipelineVertexInputStateCreateInfo *pVStack_330;
  VkPipelineRasterizationStateCreateInfo *local_328;
  VkPipelineMultisampleStateCreateInfo *local_320;
  VkPipelineDepthStencilStateCreateInfo *local_318;
  VkPipelineColorBlendStateCreateInfo *local_310;
  VkPipelineDynamicStateCreateInfo *local_308;
  VkPipelineLayout local_300;
  VkRenderPass local_2f8;
  deUint32 local_2f0;
  VkPipeline local_2e8;
  deInt32 local_2e0;
  Unique<vk::Handle<(vk::HandleType)8>_> *local_2d8;
  Unique<vk::Handle<(vk::HandleType)18>_> *local_2d0;
  Unique<vk::Handle<(vk::HandleType)16>_> *local_2c8;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *local_2c0;
  undefined1 local_2b8 [16];
  VkDevice local_2a8;
  VkAllocationCallbacks *pVStack_2a0;
  VkPipelineColorBlendAttachmentState *local_298;
  float local_290 [6];
  VkPipelineShaderStageCreateInfo local_278;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  deUint64 local_230;
  char *local_228;
  VkSpecializationInfo *local_220;
  VkShaderModule local_218;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_210;
  VkShaderModule local_1f8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_1f0;
  VkPipelineVertexInputStateCreateInfo local_1d8;
  Move<vk::Handle<(vk::HandleType)18>_> local_1a8;
  void *local_188;
  PFN_vkAllocationFunction p_Stack_180;
  PFN_vkReallocationFunction p_Stack_178;
  PFN_vkFreeFunction p_Stack_170;
  PFN_vkInternalAllocationNotification local_168;
  PFN_vkInternalFreeNotification p_Stack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  VkVertexInputBindingDescription local_148;
  VkVertexInputAttributeDescription local_138;
  VkVertexInputAttributeDescription local_120;
  VkViewport local_110;
  VkPipelineColorBlendAttachmentState local_f8;
  VkPipelineInputAssemblyStateCreateInfo local_d8;
  VkSpecializationInfo local_b8;
  VkPipelineMultisampleStateCreateInfo local_98;
  VkPipelineVertexInputStateCreateInfo local_60;
  
  this->m_vkd = vkd;
  local_2c0 = &this->m_swapchainImages;
  local_370 = swapchainImages;
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  vector(local_2c0,swapchainImages);
  lVar19 = 0;
  do {
    (this->m_renderSize).m_data[lVar19] = renderSize->m_data[lVar19];
    lVar19 = lVar19 + 1;
  } while (lVar19 == 1);
  local_188 = (void *)((ulong)framebufferFormat << 0x20);
  p_Stack_180 = (PFN_vkAllocationFunction)0x100000001;
  p_Stack_178 = (PFN_vkReallocationFunction)0x200000000;
  p_Stack_170 = (PFN_vkFreeFunction)&DAT_00000001;
  local_168 = (PFN_vkInternalAllocationNotification)CONCAT44(local_168._4_4_,0x3b9acdea);
  local_348 = &local_1d8;
  local_1d8.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_1d8._4_4_ = 2;
  pVStack_3c0 = (VkSubpassDescription *)local_368;
  local_358 = (VkDevice)0x0;
  pVStack_340 = (VkPipelineShaderStageCreateInfo *)0x0;
  local_328 = (VkPipelineRasterizationStateCreateInfo *)0x0;
  local_338 = (VkPipelineTessellationStateCreateInfo *)0x0;
  pVStack_330 = (VkPipelineVertexInputStateCreateInfo *)0x0;
  local_368._0_8_ = 0;
  local_368._8_8_ = (DeviceInterface *)0x0;
  VStack_350.m_internal = (deUint64)&DAT_00000001;
  local_248 = 0x100008000;
  local_278.pName = (char *)0x400ffffffff;
  local_278.pSpecializationInfo = (VkSpecializationInfo *)0x18000002000;
  local_278.flags = 0x8000;
  local_278.stage = 0x180;
  local_278.module.m_internal = 1;
  local_278.sType = ~VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_278._4_4_ = 0;
  local_278.pNext = (void *)0x40000002000;
  local_3e8._0_4_ = 0x26;
  local_3e8._8_8_ = (DeviceInterface *)0x0;
  local_3d8._M_allocated_capacity = 0x100000000;
  local_3c8._0_4_ = 1;
  local_3b8._0_4_ = 2;
  local_3d8._8_8_ = (VkPipelineRasterizationStateCreateInfo *)&local_188;
  pVStack_3b0 = &local_278;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)local_2b8,vkd,device,
             (VkRenderPassCreateInfo *)local_3e8,(VkAllocationCallbacks *)0x0);
  pVVar15 = pVStack_2a0;
  pVVar14 = local_2a8;
  uVar10 = local_2b8._8_8_;
  uVar9 = local_2b8._0_8_;
  local_378 = &this->m_renderPass;
  local_2b8._0_8_ = 0;
  local_2b8._8_8_ = (DeviceInterface *)0x0;
  local_2a8 = (VkDevice)0x0;
  pVStack_2a0 = (VkAllocationCallbacks *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       pVVar14;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       pVVar15;
  (local_378->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal = uVar9;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)uVar10;
  local_278.pNext = (void *)CONCAT44(local_278.pNext._4_4_,4);
  local_278.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_278._4_4_ = 0;
  local_368._4_4_ = SUB84(uVar9,4);
  local_368._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_368._8_8_ = (DeviceInterface *)0x0;
  local_358 = (VkDevice)0x0;
  VStack_350.m_internal = 0;
  local_348 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(local_348._4_4_,1);
  pVStack_340 = &local_278;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_3e8,vkd,device,
             (VkPipelineLayoutCreateInfo *)local_368,(VkAllocationCallbacks *)0x0);
  local_2c8 = &this->m_pipelineLayout;
  local_358 = (VkDevice)local_3d8._M_allocated_capacity;
  VStack_350.m_internal = local_3d8._8_8_;
  local_368._0_8_ = local_3e8._0_8_;
  local_368._8_8_ = local_3e8._8_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)local_3d8._M_allocated_capacity;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)local_3d8._8_8_;
  (local_2c8->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
       local_3e8._0_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_3e8._8_8_;
  dVar2 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
          m_internal;
  dVar3 = (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
          m_internal;
  local_3d8._M_allocated_capacity = 0x747265762d697274;
  local_3e8._8_8_ = (DeviceInterface *)0x8;
  local_3d8._8_8_ = (VkAllocationCallbacks *)0x0;
  local_3e8._0_8_ = &local_3d8;
  cVar20 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)binaryRegistry,(key_type *)local_3e8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_368,vkd,device,
             *(ProgramBinary **)(cVar20._M_node + 2),0);
  DStack_1f0.m_device = local_358;
  DStack_1f0.m_allocator = (VkAllocationCallbacks *)VStack_350.m_internal;
  local_1f8.m_internal = local_368._0_8_;
  DStack_1f0.m_deviceIface = (DeviceInterface *)local_368._8_8_;
  local_368._0_8_ = 0;
  local_368._8_8_ = (DeviceInterface *)0x0;
  local_358 = (VkDevice)0x0;
  VStack_350.m_internal = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != &local_3d8) {
    operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
  }
  local_3d8._M_allocated_capacity = 0x676172662d697274;
  local_3e8._8_8_ = (DeviceInterface *)0x8;
  local_3d8._8_8_ = local_3d8._8_8_ & 0xffffffffffffff00;
  local_3e8._0_8_ = &local_3d8;
  cVar20 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)binaryRegistry,(key_type *)local_3e8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_368,vkd,device,
             *(ProgramBinary **)(cVar20._M_node + 2),0);
  DStack_210.m_device = local_358;
  DStack_210.m_allocator = (VkAllocationCallbacks *)VStack_350.m_internal;
  local_218.m_internal = local_368._0_8_;
  DStack_210.m_deviceIface = (DeviceInterface *)local_368._8_8_;
  local_368._0_8_ = 0;
  local_368._8_8_ = (DeviceInterface *)0x0;
  local_358 = (VkDevice)0x0;
  VStack_350.m_internal = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != &local_3d8) {
    operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
  }
  local_278.pSpecializationInfo = &local_b8;
  local_b8.dataSize = 0;
  local_b8.pData = (void *)0x0;
  local_b8.mapEntryCount = 0;
  local_b8._4_4_ = 0;
  local_b8.pMapEntries = (VkSpecializationMapEntry *)0x0;
  local_278.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_278.pNext = (void *)0x0;
  local_278.flags = 0;
  local_278.stage = VK_SHADER_STAGE_VERTEX_BIT;
  local_278.module.m_internal = local_1f8.m_internal;
  local_278.pName = "main";
  local_248 = CONCAT44(local_248._4_4_,0x12);
  local_240 = 0;
  local_238 = 0x1000000000;
  local_230 = local_218.m_internal;
  local_228 = "main";
  local_3e8._8_8_ = (DeviceInterface *)0x0;
  local_3d8._M_allocated_capacity = 0;
  pVStack_3b0 = (VkPipelineShaderStageCreateInfo *)0x0;
  uStack_390 = 0;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_3c8._0_4_ = 0;
  local_3c8._4_4_ = 0;
  pVStack_3c0 = (VkSubpassDescription *)0x0;
  local_3e8._0_8_ = (pointer)0x19;
  local_3d8._8_8_ = (VkAllocationCallbacks *)0x700000000;
  local_3b8._0_4_ = 0;
  local_3b8._4_4_ = 7;
  local_398 = 7;
  local_388 = 0x3f800000bf800000;
  local_1d8.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)&local_110;
  local_110.x = 0.0;
  local_110.y = 0.0;
  local_120.format = renderSize->m_data[0];
  local_110.width = (float)local_120.format;
  local_120.offset = renderSize->m_data[1];
  local_110.height = (float)local_120.offset;
  local_110.minDepth = 0.0;
  local_110.maxDepth = 1.0;
  local_1d8.pVertexAttributeDescriptions = &local_120;
  local_120.location = 0;
  local_120.binding = 0;
  local_1d8.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_1d8.pNext = (void *)0x0;
  local_1d8.flags = 0;
  local_1d8.vertexBindingDescriptionCount = 1;
  local_1d8.vertexAttributeDescriptionCount = 1;
  local_60.pVertexBindingDescriptions = &local_148;
  local_148.binding = 0;
  local_148.stride = 0x10;
  local_348 = &local_60;
  local_60.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_60.pNext = (void *)0x0;
  local_60.flags = 0;
  local_60.vertexBindingDescriptionCount = 1;
  local_148.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_320 = &local_98;
  local_98.pNext = (void *)0x0;
  local_98.sampleShadingEnable = 0;
  local_98.minSampleShading = 0.0;
  local_98.pSampleMask = (VkSampleMask *)0x0;
  local_98.alphaToCoverageEnable = 0;
  local_98.alphaToOneEnable = 0;
  local_98.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.flags = 0;
  local_98.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_60.vertexAttributeDescriptionCount = 1;
  local_60.pVertexAttributeDescriptions = &local_138;
  local_138.location = 0;
  local_138.binding = 0;
  local_138.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  local_138.offset = 0;
  local_2b8._0_4_ = 0x1a;
  local_2b8._8_8_ = (DeviceInterface *)0x0;
  local_2a8 = (VkDevice)0x0;
  pVStack_2a0 = (VkAllocationCallbacks *)0x100000003;
  local_298 = &local_f8;
  local_f8.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  local_f8.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_f8.alphaBlendOp = VK_BLEND_OP_ADD;
  local_f8.colorWriteMask = 0xf;
  local_f8.blendEnable = 0;
  local_f8.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  local_f8.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_f8.colorBlendOp = VK_BLEND_OP_ADD;
  local_368._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_368._8_8_ = (DeviceInterface *)0x0;
  local_358 = (VkDevice)0x200000000;
  VStack_350.m_internal = (deUint64)&local_278;
  pVStack_340 = (VkPipelineShaderStageCreateInfo *)&local_d8;
  local_d8.flags = 0;
  local_d8.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_d8.primitiveRestartEnable = 0;
  local_d8._28_4_ = 0;
  local_d8.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_d8._4_4_ = 0;
  local_d8.pNext = (void *)0x0;
  local_338 = (VkPipelineTessellationStateCreateInfo *)0x0;
  pVStack_330 = &local_1d8;
  local_310 = (VkPipelineColorBlendStateCreateInfo *)local_2b8;
  local_308 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_2f0 = 0;
  local_2e8.m_internal = 0;
  local_2e0 = 0;
  p_Stack_180 = (PFN_vkAllocationFunction)0x0;
  local_158 = 0;
  local_168 = (PFN_vkInternalAllocationNotification)0x0;
  p_Stack_160 = (PFN_vkInternalFreeNotification)0x0;
  p_Stack_178 = (PFN_vkReallocationFunction)0x0;
  p_Stack_170 = (PFN_vkFreeFunction)0x0;
  local_188 = (void *)0x17;
  uStack_150 = 0x3f800000;
  local_290[0] = 0.0;
  local_290[1] = 0.0;
  local_290[2] = 0.0;
  local_290[3] = 0.0;
  local_328 = (VkPipelineRasterizationStateCreateInfo *)&local_188;
  local_318 = (VkPipelineDepthStencilStateCreateInfo *)local_3e8;
  local_300.m_internal = dVar3;
  local_2f8.m_internal = dVar2;
  local_220 = local_278.pSpecializationInfo;
  ::vk::createGraphicsPipeline
            (&local_1a8,vkd,device,(VkPipelineCache)0x0,(VkGraphicsPipelineCreateInfo *)local_368,
             (VkAllocationCallbacks *)0x0);
  if (local_218.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_210,local_218);
  }
  if (local_1f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_1f0,local_1f8);
  }
  pVVar15 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_358 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar17 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar16.m_internal =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_2d0 = &this->m_pipeline;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_358;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       pVVar15;
  (local_2d0->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
       HVar16.m_internal;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       pDVar17;
  local_368._4_4_ = (undefined4)(HVar16.m_internal >> 0x20);
  local_368._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_368._8_8_ = (DeviceInterface *)0x0;
  local_358 = (VkDevice)((ulong)local_358 & 0xffffffff00000000);
  VStack_350.m_internal = (deUint64)&DAT_00000030;
  local_348 = (VkPipelineVertexInputStateCreateInfo *)0x80;
  pVStack_340 = (VkPipelineShaderStageCreateInfo *)((ulong)pVStack_340 & 0xffffffff00000000);
  local_338 = (VkPipelineTessellationStateCreateInfo *)0x0;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_3e8,vkd,device,
                     (VkBufferCreateInfo *)local_368,(VkAllocationCallbacks *)0x0);
  uVar12 = local_3d8._8_8_;
  uVar11 = local_3d8._M_allocated_capacity;
  uVar10 = local_3e8._8_8_;
  uVar9 = local_3e8._0_8_;
  local_2d8 = &this->m_vertexBuffer;
  local_358 = (VkDevice)local_3d8._M_allocated_capacity;
  VStack_350.m_internal = local_3d8._8_8_;
  local_368._0_8_ = local_3e8._0_8_;
  local_368._8_8_ = local_3e8._8_8_;
  local_3e8._0_8_ = (Allocation *)0x0;
  local_3e8._8_8_ = (DeviceInterface *)0x0;
  local_3d8._M_allocated_capacity = 0;
  local_3d8._8_8_ = (VkAllocationCallbacks *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)uVar11;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)uVar12;
  (local_2d8->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal = uVar9;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)uVar10;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_368,vkd,device,
             (VkBuffer)
             (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal);
  (*allocator->_vptr_Allocator[3])(local_3e8,allocator,local_368,1);
  pvVar13 = local_370;
  uVar9 = local_3e8._0_8_;
  local_3e8._0_8_ = (pointer)0x0;
  (this->m_vertexBufferMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)uVar9;
  this_00 = &this->m_attachmentViews;
  (this->m_framebuffers).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_framebuffers).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_attachmentViews).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_framebuffers).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attachmentViews).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attachmentViews).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::resize(this_00,(long)(local_370->
                         super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_370->
                         super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::resize(&this->m_framebuffers,
           (long)(pvVar13->
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar13->
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3);
  pHVar24 = (pvVar13->
            super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar13->
      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pHVar24) {
    lVar19 = 0;
    uVar23 = 0;
    do {
      pdVar21 = (deUint64 *)operator_new(0x20);
      VStack_350.m_internal = pHVar24[uVar23].m_internal;
      local_368._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      local_368._8_8_ = (DeviceInterface *)0x0;
      local_358 = (VkDevice)((ulong)local_358 & 0xffffffff00000000);
      local_348 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(framebufferFormat,1);
      pVStack_340 = (VkPipelineShaderStageCreateInfo *)0x400000003;
      local_338 = (VkPipelineTessellationStateCreateInfo *)0x600000005;
      pVStack_330 = (VkPipelineVertexInputStateCreateInfo *)&DAT_00000001;
      local_328 = (VkPipelineRasterizationStateCreateInfo *)&DAT_00000001;
      local_320 = (VkPipelineMultisampleStateCreateInfo *)CONCAT44(local_320._4_4_,1);
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)local_3e8,vkd,device,
                 (VkImageViewCreateInfo *)local_368,(VkAllocationCallbacks *)0x0);
      pdVar21[2] = local_3d8._M_allocated_capacity;
      pdVar21[3] = local_3d8._8_8_;
      *pdVar21 = local_3e8._0_8_;
      pdVar21[1] = local_3e8._8_8_;
      local_3e8._0_8_ = (pointer)0x0;
      local_3e8._8_8_ = (DeviceInterface *)0x0;
      local_3d8._M_allocated_capacity = 0;
      local_3d8._8_8_ = (VkAllocationCallbacks *)0x0;
      plVar22 = (long *)operator_new(0x20);
      *(undefined4 *)(plVar22 + 1) = 0;
      *(undefined4 *)((long)plVar22 + 0xc) = 0;
      *plVar22 = (long)&PTR__SharedPtrState_00d53520;
      plVar22[2] = (long)pdVar21;
      *(undefined4 *)(plVar22 + 1) = 1;
      *(undefined4 *)((long)plVar22 + 0xc) = 1;
      pSVar4 = (this_00->
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      plVar5 = *(long **)((long)&pSVar4->m_state + lVar19);
      if (plVar5 != plVar22) {
        if (plVar5 != (long *)0x0) {
          LOCK();
          plVar5 = plVar5 + 1;
          *(int *)plVar5 = (int)*plVar5 + -1;
          UNLOCK();
          if ((int)*plVar5 == 0) {
            *(undefined8 *)((long)&pSVar4->m_ptr + lVar19) = 0;
            (**(code **)(**(long **)((long)&pSVar4->m_state + lVar19) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar4->m_state + lVar19) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar5 = *(long **)((long)&pSVar4->m_state + lVar19);
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 8))();
            }
            *(undefined8 *)((long)&pSVar4->m_state + lVar19) = 0;
          }
        }
        *(deUint64 **)((long)&pSVar4->m_ptr + lVar19) = pdVar21;
        *(long **)((long)&pSVar4->m_state + lVar19) = plVar22;
        LOCK();
        *(int *)(plVar22 + 1) = (int)plVar22[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar4->m_state + lVar19) + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar5 = plVar22 + 1;
      *(int *)plVar5 = (int)*plVar5 + -1;
      UNLOCK();
      if ((int)*plVar5 == 0) {
        (**(code **)(*plVar22 + 0x10))(plVar22);
      }
      LOCK();
      piVar1 = (int *)((long)plVar22 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar22 + 8))(plVar22);
      }
      if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_3e8 + 8),
                   (VkImageView)local_3e8._0_8_);
      }
      pdVar21 = (deUint64 *)operator_new(0x20);
      VStack_350.m_internal =
           (local_378->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal;
      local_278._0_8_ =
           **(undefined8 **)
             ((long)&((this_00->
                      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar19);
      local_368._0_4_ = 0x25;
      local_368._8_8_ = (DeviceInterface *)0x0;
      local_358 = (VkDevice)((ulong)local_358 & 0xffffffff00000000);
      local_348 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(local_348._4_4_,1);
      local_338 = *(VkPipelineTessellationStateCreateInfo **)renderSize->m_data;
      pVStack_330 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(pVStack_330._4_4_,1);
      pVStack_340 = &local_278;
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)local_3e8,vkd,device,
                 (VkFramebufferCreateInfo *)local_368,(VkAllocationCallbacks *)0x0);
      pdVar21[2] = local_3d8._M_allocated_capacity;
      pdVar21[3] = local_3d8._8_8_;
      *pdVar21 = local_3e8._0_8_;
      pdVar21[1] = local_3e8._8_8_;
      local_3e8._0_8_ = (pointer)0x0;
      local_3e8._8_8_ = (DeviceInterface *)0x0;
      local_3d8._M_allocated_capacity = 0;
      local_3d8._8_8_ = (VkAllocationCallbacks *)0x0;
      plVar22 = (long *)operator_new(0x20);
      *(undefined4 *)(plVar22 + 1) = 0;
      *(undefined4 *)((long)plVar22 + 0xc) = 0;
      *plVar22 = (long)&PTR__SharedPtrState_00d538a0;
      plVar22[2] = (long)pdVar21;
      *(undefined4 *)(plVar22 + 1) = 1;
      *(undefined4 *)((long)plVar22 + 0xc) = 1;
      pSVar6 = (this->m_framebuffers).
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar5 = *(long **)((long)&pSVar6->m_state + lVar19);
      if (plVar5 != plVar22) {
        if (plVar5 != (long *)0x0) {
          LOCK();
          plVar5 = plVar5 + 1;
          *(int *)plVar5 = (int)*plVar5 + -1;
          UNLOCK();
          if ((int)*plVar5 == 0) {
            *(undefined8 *)((long)&pSVar6->m_ptr + lVar19) = 0;
            (**(code **)(**(long **)((long)&pSVar6->m_state + lVar19) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar6->m_state + lVar19) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar5 = *(long **)((long)&pSVar6->m_state + lVar19);
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 8))();
            }
            *(undefined8 *)((long)&pSVar6->m_state + lVar19) = 0;
          }
        }
        *(deUint64 **)((long)&pSVar6->m_ptr + lVar19) = pdVar21;
        *(long **)((long)&pSVar6->m_state + lVar19) = plVar22;
        LOCK();
        *(int *)(plVar22 + 1) = (int)plVar22[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar6->m_state + lVar19) + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar5 = plVar22 + 1;
      *(int *)plVar5 = (int)*plVar5 + -1;
      UNLOCK();
      if ((int)*plVar5 == 0) {
        (**(code **)(*plVar22 + 0x10))(plVar22);
      }
      LOCK();
      piVar1 = (int *)((long)plVar22 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar22 + 8))(plVar22);
      }
      if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_3e8 + 8),
                   (VkFramebuffer)local_3e8._0_8_);
      }
      uVar23 = uVar23 + 1;
      pHVar24 = (local_370->
                super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar19 = lVar19 + 0x10;
    } while (uVar23 < (ulong)((long)(local_370->
                                    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar24 >> 3
                             ));
  }
  pAVar7 = (this->m_vertexBufferMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  VVar18 = (*vkd->_vptr_DeviceInterface[0xc])
                     (vkd,device,
                      (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                      object.m_internal,(pAVar7->m_memory).m_internal,pAVar7->m_offset);
  ::vk::checkResult(VVar18,
                    "vkd.bindBufferMemory(device, *m_vertexBuffer, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x49f);
  local_368._0_4_ = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
  local_368._8_8_ = (DeviceInterface *)0x0;
  pAVar7 = (this->m_vertexBufferMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_358 = (VkDevice)(pAVar7->m_memory).m_internal;
  VStack_350.m_internal = pAVar7->m_offset;
  local_348 = (VkPipelineVertexInputStateCreateInfo *)0xffffffffffffffff;
  puVar8 = (undefined8 *)pAVar7->m_hostPtr;
  *puVar8 = 0xbf000000bf000000;
  puVar8[1] = 0x3f80000000000000;
  puVar8[2] = 0xbf0000003f000000;
  puVar8[3] = 0x3f80000000000000;
  *(undefined4 *)(puVar8 + 4) = 0;
  *(undefined4 *)((long)puVar8 + 0x24) = 0x3f000000;
  *(undefined4 *)(puVar8 + 5) = 0;
  *(undefined4 *)((long)puVar8 + 0x2c) = 0x3f800000;
  VVar18 = (*vkd->_vptr_DeviceInterface[9])(vkd,device,1);
  ::vk::checkResult(VVar18,"vkd.flushMappedMemoryRanges(device, 1u, &memRange)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x4b3);
  return;
}

Assistant:

TriangleRenderer::TriangleRenderer (const DeviceInterface&	vkd,
									const VkDevice			device,
									Allocator&				allocator,
									const BinaryCollection&	binaryRegistry,
									const vector<VkImage>	swapchainImages,
									const VkFormat			framebufferFormat,
									const UVec2&			renderSize)
	: m_vkd					(vkd)
	, m_swapchainImages		(swapchainImages)
	, m_renderSize			(renderSize)
	, m_renderPass			(createRenderPass(vkd, device, framebufferFormat))
	, m_pipelineLayout		(createPipelineLayout(vkd, device))
	, m_pipeline			(createPipeline(vkd, device, *m_renderPass, *m_pipelineLayout, binaryRegistry, renderSize))
	, m_vertexBuffer		(createBuffer(vkd, device, (VkDeviceSize)(sizeof(float)*4*3), VK_BUFFER_USAGE_VERTEX_BUFFER_BIT))
	, m_vertexBufferMemory	(allocator.allocate(getBufferMemoryRequirements(vkd, device, *m_vertexBuffer),
							 MemoryRequirement::HostVisible))
{
	m_attachmentViews.resize(swapchainImages.size());
	m_framebuffers.resize(swapchainImages.size());

	for (size_t imageNdx = 0; imageNdx < swapchainImages.size(); ++imageNdx)
	{
		m_attachmentViews[imageNdx]	= ImageViewSp(new Unique<VkImageView>(createAttachmentView(vkd, device, swapchainImages[imageNdx], framebufferFormat)));
		m_framebuffers[imageNdx]	= FramebufferSp(new Unique<VkFramebuffer>(createFramebuffer(vkd, device, *m_renderPass, **m_attachmentViews[imageNdx], renderSize)));
	}

	VK_CHECK(vkd.bindBufferMemory(device, *m_vertexBuffer, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset()));

	{
		const VkMappedMemoryRange	memRange	=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,
			DE_NULL,
			m_vertexBufferMemory->getMemory(),
			m_vertexBufferMemory->getOffset(),
			VK_WHOLE_SIZE
		};
		const tcu::Vec4				vertices[]	=
		{
			tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
			tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
			tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
		};
		DE_STATIC_ASSERT(sizeof(vertices) == sizeof(float)*4*3);

		deMemcpy(m_vertexBufferMemory->getHostPtr(), &vertices[0], sizeof(vertices));
		VK_CHECK(vkd.flushMappedMemoryRanges(device, 1u, &memRange));
	}
}